

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

int __thiscall Jupiter::Timer::kill(Timer *this,__pid_t __pid,int __sig)

{
  bool bVar1;
  uint uVar2;
  Timer *this_local;
  
  bVar1 = removeFromList(this);
  if (bVar1) {
    if (this != (Timer *)0x0) {
      uVar2 = (*(this->super_Thinker)._vptr_Thinker[2])();
      this = (Timer *)(ulong)uVar2;
    }
    this_local._7_1_ = 1;
  }
  else {
    if (this != (Timer *)0x0) {
      uVar2 = (*(this->super_Thinker)._vptr_Thinker[2])();
      this = (Timer *)(ulong)uVar2;
    }
    this_local._7_1_ = 0;
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool Jupiter::Timer::kill()
{
	if (this->removeFromList())
	{
		delete this;
		return true;
	}

	delete this;
	return false;
}